

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  float fVar1;
  ImDrawList *pIVar2;
  ImGuiWindow *this;
  ImFont *font;
  char *text_begin;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  ImGuiWindow **ppIVar5;
  char *text_end;
  ImGuiCol idx;
  bool bVar6;
  ImRect IVar7;
  float local_128;
  bool window_is_focused;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImRect local_d8;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImRect local_98;
  undefined1 local_88 [8];
  ImRect title_r;
  ImRect thumb_r;
  ImGuiWindow *thumb_window;
  int i;
  float alpha_mul;
  ImVec2 local_48;
  ImVec2 off;
  ImVec2 local_38;
  ImVec2 scale;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *bb_local;
  ImGuiViewportP *viewport_local;
  ImDrawList *draw_list_local;
  
  pIVar3 = GImGui;
  scale = (ImVec2)GImGui->CurrentWindow;
  off = ImRect::GetSize(bb);
  local_38 = operator/(&off,&(viewport->super_ImGuiViewport).Size);
  _i = operator*(&(viewport->super_ImGuiViewport).Pos,&local_38);
  local_48 = operator-(&bb->Min,(ImVec2 *)&i);
  local_128 = 0.3;
  if (((viewport->super_ImGuiViewport).Flags & 0x400U) == 0) {
    local_128 = 1.0;
  }
  pIVar2 = *(ImDrawList **)((long)scale + 0x2a8);
  IVar4 = GetColorU32(5,local_128 * 0.4);
  ImDrawList::AddRectFilled(pIVar2,&bb->Min,&bb->Max,IVar4,0.0,0);
  for (thumb_window._0_4_ = 0; (int)thumb_window != (pIVar3->Windows).Size;
      thumb_window._0_4_ = (int)thumb_window + 1) {
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&pIVar3->Windows,(int)thumb_window);
    this = *ppIVar5;
    if ((((this->WasActive & 1U) != 0) && ((this->Flags & 0x1000000U) == 0)) &&
       (this->Viewport == viewport)) {
      IVar7 = ImGuiWindow::Rect(this);
      thumb_r.Min = IVar7.Max;
      title_r.Max = IVar7.Min;
      IVar7 = ImGuiWindow::TitleBarRect(this);
      title_r.Min = IVar7.Max;
      local_88 = (undefined1  [8])IVar7.Min;
      local_b0 = operator*(&title_r.Max,&local_38);
      local_a8 = operator+(&local_48,&local_b0);
      local_a0 = ImFloor(&local_a8);
      local_c8 = operator*(&thumb_r.Min,&local_38);
      local_c0 = operator+(&local_48,&local_c8);
      local_b8 = ImFloor(&local_c0);
      ImRect::ImRect(&local_98,&local_a0,&local_b8);
      title_r.Max = local_98.Min;
      thumb_r.Min = local_98.Max;
      local_f0 = operator*((ImVec2 *)local_88,&local_38);
      local_e8 = operator+(&local_48,&local_f0);
      local_e0 = ImFloor(&local_e8);
      ImVec2::ImVec2(&local_118,title_r.Min.x,(float)local_88._4_4_);
      local_110 = operator*(&local_118,&local_38);
      local_108 = operator+(&local_48,&local_110);
      local_100 = ImFloor(&local_108);
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffee0,0.0,5.0);
      local_f8 = operator+(&local_100,(ImVec2 *)&stack0xfffffffffffffee0);
      ImRect::ImRect(&local_d8,&local_e0,&local_f8);
      local_88._0_4_ = local_d8.Min.x;
      local_88._4_4_ = local_d8.Min.y;
      title_r.Min = local_d8.Max;
      ImRect::ClipWithFull((ImRect *)&title_r.Max,bb);
      ImRect::ClipWithFull((ImRect *)local_88,bb);
      bVar6 = false;
      if (pIVar3->NavWindow != (ImGuiWindow *)0x0) {
        bVar6 = this->RootWindowForTitleBarHighlight ==
                pIVar3->NavWindow->RootWindowForTitleBarHighlight;
      }
      pIVar2 = *(ImDrawList **)((long)scale + 0x2a8);
      IVar4 = GetColorU32(2,local_128);
      ImDrawList::AddRectFilled(pIVar2,&title_r.Max,&thumb_r.Min,IVar4,0.0,0);
      pIVar2 = *(ImDrawList **)((long)scale + 0x2a8);
      idx = 10;
      if (bVar6) {
        idx = 0xb;
      }
      IVar4 = GetColorU32(idx,local_128);
      ImDrawList::AddRectFilled(pIVar2,(ImVec2 *)local_88,&title_r.Min,IVar4,0.0,0);
      pIVar2 = *(ImDrawList **)((long)scale + 0x2a8);
      IVar4 = GetColorU32(5,local_128);
      ImDrawList::AddRect(pIVar2,&title_r.Max,&thumb_r.Min,IVar4,0.0,0,1.0);
      pIVar2 = *(ImDrawList **)((long)scale + 0x2a8);
      font = pIVar3->Font;
      fVar1 = pIVar3->FontSize;
      IVar4 = GetColorU32(0,local_128);
      text_begin = this->Name;
      text_end = FindRenderedTextEnd(this->Name,(char *)0x0);
      ImDrawList::AddText(pIVar2,font,fVar1 * 1.0,(ImVec2 *)local_88,IVar4,text_begin,text_end,0.0,
                          (ImVec4 *)0x0);
    }
  }
  IVar4 = GetColorU32(5,local_128);
  ImDrawList::AddRect(draw_list,&bb->Min,&bb->Max,IVar4,0.0,0,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = (viewport->Flags & ImGuiViewportFlags_Minimized) ? 0.30f : 1.00f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, ImGui::GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;
        if (thumb_window->Viewport != viewport)
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}